

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O2

void sat_solver_bookmark(sat_solver *s)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int **ppiVar4;
  
  if (s->qhead != s->qtail) {
    __assert_fail("s->qhead == s->qtail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                  ,0x114,"void sat_solver_bookmark(sat_solver *)");
  }
  iVar2 = s->size;
  s->iVarPivot = iVar2;
  s->iTrailPivot = s->qhead;
  *(undefined8 *)(s->Mem).BookMarkE = *(undefined8 *)(s->Mem).nEntries;
  iVar3 = (s->Mem).iPage[0];
  bVar1 = (byte)(s->Mem).nPageSize;
  ppiVar4 = (s->Mem).pPages;
  (s->Mem).BookMarkH[0] = iVar3 << (bVar1 & 0x1f) | *ppiVar4[iVar3];
  iVar3 = (s->Mem).iPage[1];
  (s->Mem).BookMarkH[1] = iVar3 << (bVar1 & 0x1f) | *ppiVar4[iVar3];
  if (s->activity2 != (uint *)0x0) {
    s->var_inc2 = s->var_inc;
    memcpy(s->activity2,s->activity,(long)iVar2 << 2);
    return;
  }
  return;
}

Assistant:

static inline void sat_solver_bookmark(sat_solver* s)
{
    assert( s->qhead == s->qtail );
    s->iVarPivot    = s->size;
    s->iTrailPivot  = s->qhead;
    Sat_MemBookMark( &s->Mem );
    if ( s->activity2 )
    {
        s->var_inc2 = s->var_inc;
        memcpy( s->activity2, s->activity, sizeof(unsigned) * s->iVarPivot );
    }
}